

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

Change * __thiscall Patch::change_for_root_node(Change *__return_storage_ptr__,Patch *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Point PVar4;
  Point PVar5;
  pointer pTVar6;
  pointer pTVar7;
  uint32_t preceding_new_text_size;
  uint32_t preceding_old_text_size;
  uint32_t old_text_size;
  Text *new_text;
  Text *old_text;
  Point new_end;
  Point old_end;
  Point new_start;
  Point old_start;
  Patch *this_local;
  
  new_start = this->root->old_distance_from_left_ancestor;
  old_end = this->root->new_distance_from_left_ancestor;
  PVar4 = Point::traverse(&new_start,&this->root->old_extent);
  PVar5 = Point::traverse(&old_end,&this->root->new_extent);
  pTVar6 = std::unique_ptr<Text,_std::default_delete<Text>_>::get(&this->root->old_text);
  pTVar7 = std::unique_ptr<Text,_std::default_delete<Text>_>::get(&this->root->new_text);
  uVar1 = Node::old_text_size(this->root);
  uVar2 = Node::left_subtree_old_text_size(this->root);
  uVar3 = Node::left_subtree_new_text_size(this->root);
  __return_storage_ptr__->old_start = new_start;
  __return_storage_ptr__->old_end = PVar4;
  __return_storage_ptr__->new_start = old_end;
  __return_storage_ptr__->new_end = PVar5;
  __return_storage_ptr__->old_text = pTVar6;
  __return_storage_ptr__->new_text = pTVar7;
  __return_storage_ptr__->preceding_old_text_size = uVar2;
  __return_storage_ptr__->preceding_new_text_size = uVar3;
  __return_storage_ptr__->old_text_size = uVar1;
  return __return_storage_ptr__;
}

Assistant:

Change Patch::change_for_root_node() {
  Point old_start = root->old_distance_from_left_ancestor;
  Point new_start = root->new_distance_from_left_ancestor;
  Point old_end = old_start.traverse(root->old_extent);
  Point new_end = new_start.traverse(root->new_extent);
  Text *old_text = root->old_text.get();
  Text *new_text = root->new_text.get();
  uint32_t old_text_size = root->old_text_size();
  uint32_t preceding_old_text_size = root->left_subtree_old_text_size();
  uint32_t preceding_new_text_size = root->left_subtree_new_text_size();
  return Change{
    old_start,
    old_end,
    new_start,
    new_end,
    old_text,
    new_text,
    preceding_old_text_size,
    preceding_new_text_size,
    old_text_size,
  };
}